

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O1

int elias_gamma_bits(int value)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 1;
  if (1 < value) {
    do {
      iVar2 = iVar2 + 2;
      bVar1 = 3 < (uint)value;
      value = (uint)value >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int elias_gamma_bits(int value) {
    int bits;

    bits = 1;
    while (value > 1) {
        bits += 2;
        value >>= 1;
    }
    return bits;
}